

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::WeakFulfiller<kj::Promise<int>_>::detach
          (WeakFulfiller<kj::Promise<int>_> *this,PromiseFulfiller<kj::Promise<int>_> *from)

{
  if (this->inner != (PromiseFulfiller<kj::Promise<int>_> *)0x0) {
    this->inner = (PromiseFulfiller<kj::Promise<int>_> *)0x0;
    return;
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

void detach(PromiseFulfiller<T>& from) {
    if (inner == nullptr) {
      // Already disposed.
      delete this;
    } else {
      KJ_IREQUIRE(inner == &from);
      inner = nullptr;
    }
  }